

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O3

void __thiscall ParserTestCanonicalizePaths::Run(ParserTestCanonicalizePaths *this)

{
  int iVar1;
  Test *pTVar2;
  Node *pNVar3;
  State *this_00;
  StringPiece path;
  StringPiece path_00;
  StringPiece path_01;
  StringPiece path_02;
  
  iVar1 = g_current_test->assertion_failures_;
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "rule cat\n  command = cat $in > $out\nbuild ./out.o: cat ./bar/baz/../foo.cc\n");
  pTVar2 = g_current_test;
  if (iVar1 == g_current_test->assertion_failures_) {
    this_00 = &(this->super_ParserTest).state;
    path.len_ = 7;
    path.str_ = "./out.o";
    pNVar3 = State::LookupNode(this_00,path);
    testing::Test::Check
              (pTVar2,pNVar3 == (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
               ,299,"state.LookupNode(\"./out.o\")");
    pTVar2 = g_current_test;
    path_00.len_ = 5;
    path_00.str_ = "out.o";
    pNVar3 = State::LookupNode(this_00,path_00);
    testing::Test::Check
              (pTVar2,pNVar3 != (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
               ,300,"state.LookupNode(\"out.o\")");
    pTVar2 = g_current_test;
    path_01.len_ = 0x13;
    path_01.str_ = "./bar/baz/../foo.cc";
    pNVar3 = State::LookupNode(this_00,path_01);
    testing::Test::Check
              (pTVar2,pNVar3 == (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
               ,0x12d,"state.LookupNode(\"./bar/baz/../foo.cc\")");
    pTVar2 = g_current_test;
    path_02.len_ = 10;
    path_02.str_ = "bar/foo.cc";
    pNVar3 = State::LookupNode(this_00,path_02);
    testing::Test::Check
              (pTVar2,pNVar3 != (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
               ,0x12e,"state.LookupNode(\"bar/foo.cc\")");
    return;
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  return;
}

Assistant:

TEST_F(ParserTest, CanonicalizePaths) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n"
"  command = cat $in > $out\n"
"build ./out.o: cat ./bar/baz/../foo.cc\n"));

  EXPECT_FALSE(state.LookupNode("./out.o"));
  EXPECT_TRUE(state.LookupNode("out.o"));
  EXPECT_FALSE(state.LookupNode("./bar/baz/../foo.cc"));
  EXPECT_TRUE(state.LookupNode("bar/foo.cc"));
}